

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-read-stop.c
# Opt level: O3

int run_test_tcp_read_stop(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 extraout_RAX;
  undefined8 in_R9;
  int64_t eval_b;
  int64_t eval_b_3;
  sockaddr_in addr;
  uv_connect_t connect_req;
  uv_buf_t uStack_c0;
  undefined8 uStack_a8;
  code *pcStack_a0;
  long local_90;
  long local_88;
  sockaddr_in local_80;
  uv_connect_t local_70;
  
  pcStack_a0 = (code *)0x1ca762;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&local_80);
  local_70.data = (void *)(long)iVar1;
  local_90 = 0;
  if (local_70.data == (void *)0x0) {
    pcStack_a0 = (code *)0x1ca787;
    puVar2 = uv_default_loop();
    pcStack_a0 = (code *)0x1ca796;
    iVar1 = uv_timer_init(puVar2,&timer_handle);
    local_70.data = (void *)(long)iVar1;
    local_90 = 0;
    if (local_70.data != (void *)0x0) goto LAB_001ca8c1;
    pcStack_a0 = (code *)0x1ca7bb;
    puVar2 = uv_default_loop();
    pcStack_a0 = (code *)0x1ca7ca;
    iVar1 = uv_tcp_init(puVar2,&tcp_handle);
    local_70.data = (void *)(long)iVar1;
    local_90 = 0;
    if (local_70.data != (void *)0x0) goto LAB_001ca8d0;
    pcStack_a0 = (code *)0x1ca807;
    iVar1 = uv_tcp_connect(&local_70,&tcp_handle,(sockaddr *)&local_80,connect_cb);
    local_90 = (long)iVar1;
    local_88 = 0;
    if (local_90 != 0) goto LAB_001ca8df;
    pcStack_a0 = (code *)0x1ca82c;
    puVar2 = uv_default_loop();
    pcStack_a0 = (code *)0x1ca836;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    local_90 = (long)iVar1;
    local_88 = 0;
    if (local_90 != 0) goto LAB_001ca8ee;
    pcStack_a0 = (code *)0x1ca85b;
    puVar2 = uv_default_loop();
    pcStack_a0 = (code *)0x1ca86f;
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    pcStack_a0 = (code *)0x1ca879;
    uv_run(puVar2,UV_RUN_DEFAULT);
    local_90 = 0;
    pcStack_a0 = (code *)0x1ca887;
    puVar2 = uv_default_loop();
    pcStack_a0 = (code *)0x1ca88f;
    iVar1 = uv_loop_close(puVar2);
    local_88 = (long)iVar1;
    if (local_90 == local_88) {
      pcStack_a0 = (code *)0x1ca8a7;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_a0 = (code *)0x1ca8c1;
    run_test_tcp_read_stop_cold_1();
LAB_001ca8c1:
    pcStack_a0 = (code *)0x1ca8d0;
    run_test_tcp_read_stop_cold_2();
LAB_001ca8d0:
    pcStack_a0 = (code *)0x1ca8df;
    run_test_tcp_read_stop_cold_3();
LAB_001ca8df:
    pcStack_a0 = (code *)0x1ca8ee;
    run_test_tcp_read_stop_cold_4();
LAB_001ca8ee:
    pcStack_a0 = (code *)0x1ca8fd;
    run_test_tcp_read_stop_cold_5();
  }
  iVar1 = (int)&local_88;
  pcStack_a0 = connect_cb;
  run_test_tcp_read_stop_cold_6();
  pcStack_a0 = (code *)(long)iVar1;
  uStack_a8 = 0;
  if (pcStack_a0 == (code *)0x0) {
    uStack_c0.len = 0x1ca947;
    iVar1 = uv_timer_start(&timer_handle,timer_cb,0x32,0);
    pcStack_a0 = (code *)(long)iVar1;
    uStack_a8 = 0;
    if (pcStack_a0 == (code *)0x0) {
      uStack_c0.len = 0x1ca979;
      iVar1 = uv_read_start((uv_stream_t *)&tcp_handle,fail_cb,fail_cb);
      pcStack_a0 = (code *)(long)iVar1;
      uStack_a8 = 0;
      if (pcStack_a0 == (code *)0x0) {
        return iVar1;
      }
      goto LAB_001ca9b8;
    }
  }
  else {
    uStack_c0.len = 0x1ca9a9;
    connect_cb_cold_1();
  }
  uStack_c0.len = 0x1ca9b8;
  connect_cb_cold_2();
LAB_001ca9b8:
  uStack_c0.len = (size_t)timer_cb;
  connect_cb_cold_3();
  uStack_c0 = uv_buf_init("PING",4);
  iVar1 = uv_write(&write_req,(uv_stream_t *)&tcp_handle,&uStack_c0,1,write_cb);
  if (iVar1 == 0) {
    iVar1 = uv_read_stop((uv_stream_t *)&tcp_handle);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    timer_cb_cold_1();
  }
  timer_cb_cold_2();
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-read-stop.c"
          ,0x1f,"0 && \"fail_cb called\"",in_R9,extraout_RAX);
  abort();
}

Assistant:

TEST_IMPL(tcp_read_stop) {
  uv_connect_t connect_req;
  struct sockaddr_in addr;

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  ASSERT_OK(uv_timer_init(uv_default_loop(), &timer_handle));
  ASSERT_OK(uv_tcp_init(uv_default_loop(), &tcp_handle));
  ASSERT_OK(uv_tcp_connect(&connect_req,
                           &tcp_handle,
                           (const struct sockaddr*) &addr,
                           connect_cb));
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  MAKE_VALGRIND_HAPPY(uv_default_loop());

  return 0;
}